

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

void FenToSituation(Situation *situation,char *fen,int num_of_movements,char *movements)

{
  int position_col;
  int position_row;
  long in_RCX;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  Movement MVar1;
  Movement move;
  int k;
  string s;
  int n;
  int j;
  int no_piece;
  int piece_id;
  int piece_id_index;
  int row;
  int col;
  int piece_id_array [14];
  char *p;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  string local_f0 [31];
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff3c;
  int local_c0;
  allocator local_a9;
  string local_a8 [36];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_68 [16];
  char *local_28;
  long local_20;
  int local_14;
  int *local_8;
  
  local_28 = in_RSI;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  memcpy(local_68,&DAT_0011a040,0x38);
  position_col = GetCol(0x33);
  position_row = GetRow(0x33);
  for (; *local_28 != ' '; local_28 = local_28 + 1) {
    if (*local_28 == '/') {
      position_col = 3;
      position_row = position_row + 1;
    }
    else if ((*local_28 < '1') || ('9' < *local_28)) {
      local_74 = PieceOfFen(*local_28);
      local_78 = local_68[local_74];
      local_68[local_74] = local_68[local_74] + 1;
      GetPosition(position_col,position_row);
      AddPiece((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),(int)in_stack_fffffffffffffef0,
               (Situation *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      position_col = position_col + 1;
    }
    else {
      local_7c = *local_28 + -0x30;
      position_col = local_7c + position_col;
    }
  }
  local_28 = local_28 + 1;
  if (*local_28 == 'w') {
    *local_8 = 0;
  }
  else {
    *local_8 = 1;
  }
  if (*local_8 == 0) {
    ZobristKey = ZobristPlayer ^ ZobristKey;
    ZobristKeyCheck = ZobristPlayerCheck ^ ZobristKeyCheck;
  }
  local_80 = 0;
  for (local_84 = 0; local_84 < local_14; local_84 = local_84 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    for (local_c0 = local_80; local_c0 < local_80 + 4; local_c0 = local_c0 + 1) {
      std::__cxx11::string::operator+=(local_a8,*(char *)(local_20 + local_c0));
    }
    std::__cxx11::string::string(local_f0,local_a8);
    MVar1 = StrToMovement((string *)CONCAT44(position_col,position_row));
    std::__cxx11::string::~string(local_f0);
    MakeAMove((Situation *)CONCAT44(in_stack_ffffffffffffff3c,MVar1._8_4_),MVar1._0_8_,
              (bool)in_stack_ffffffffffffff2f);
    local_80 = local_80 + 5;
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void FenToSituation(Situation & situation, const char* fen, const int num_of_movements, const char *movements){
    const char *p = fen;
    int piece_id_array[14] = {16, 17, 19, 21, 23, 25, 27, 32, 33, 35, 37, 39, 41, 43};
    int col = GetCol(BOARD_FIRST_POSITION), row = GetRow(BOARD_FIRST_POSITION), piece_id_index, piece_id;
    // 1. 写入局面
    while(*p != ' '){
        if(*p == '/'){
            col = 3;
            row ++;
        }
        else if(*p > '0' && *p <= '9'){
            int no_piece = *p - '0';
            col += no_piece;
        }
        else{
            piece_id_index = PieceOfFen(*p);
            piece_id = piece_id_array[piece_id_index];
            piece_id_array[piece_id_index] ++;
            AddPiece(GetPosition(col, row), piece_id, situation);
            col ++;
        }
        p ++;
    }

    // 2. 写入当前玩家
    p ++;
    if(*p == 'w') situation.current_player = RED;
    else situation.current_player = BLACK;

    // 3. 若轮到红方走子，局面哈希值异或额外标记
    if(situation.current_player == RED){
        ZobristKey ^= ZobristPlayer;
        ZobristKeyCheck ^= ZobristPlayerCheck;
    }

    // 4. 将后续着法转入局面
    int j = 0;
    for ( int n = 0; n < num_of_movements; n ++ ) {
    	std::string s = "";
    	for (int k = j; k < j + 4; k ++ ) {
    		s += movements[k];
    	}
    	Movement move = StrToMovement(s);
        MakeAMove(situation, move, 1);
    	j += 5;
    }
}